

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearConstraint.cpp
# Opt level: O1

bool __thiscall
iDynTree::optimalcontrol::LinearConstraint::constraintJacobianWRTState
          (LinearConstraint *this,double time,VectorDynSize *state,VectorDynSize *param_3,
          MatrixDynSize *jacobian)

{
  element_type *peVar1;
  char *pcVar2;
  char cVar3;
  int iVar4;
  size_t sVar5;
  undefined4 extraout_var;
  long lVar6;
  long lVar7;
  size_t sVar8;
  ostream *poVar9;
  string *psVar10;
  bool isValid;
  ostringstream errorMsg;
  char local_1d1;
  double local_1d0;
  long *local_1c8;
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1d0 = time;
  sVar5 = Constraint::constraintSize(&this->super_Constraint);
  iDynTree::VectorDynSize::size();
  iDynTree::MatrixDynSize::resize((ulong)jacobian,sVar5 & 0xffffffff);
  if (this->m_pimpl->constrainsState != true) {
    iDynTree::MatrixDynSize::zero();
    return true;
  }
  local_1d1 = '\0';
  peVar1 = (this->m_pimpl->stateConstraintMatrix).
           super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  iVar4 = (*peVar1->_vptr_TimeVaryingObject[2])(local_1d0,peVar1,&local_1d1);
  cVar3 = local_1d1;
  if (local_1d1 == '\0') {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Unable to retrieve a valid state constraint matrix at time: ",
               0x3c);
    poVar9 = std::ostream::_M_insert<double>(local_1d0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,".",1);
    psVar10 = Constraint::name_abi_cxx11_(&this->super_Constraint);
    pcVar2 = (psVar10->_M_dataplus)._M_p;
    std::__cxx11::stringbuf::str();
    iDynTree::reportError(pcVar2,"constraintJacobianWRTState",(char *)local_1c8);
    if (local_1c8 != local_1b8) {
      operator_delete(local_1c8,local_1b8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    goto LAB_0016fcd4;
  }
  lVar6 = iDynTree::MatrixDynSize::cols();
  lVar7 = iDynTree::VectorDynSize::size();
  if (lVar6 == lVar7) {
    sVar5 = iDynTree::MatrixDynSize::rows();
    sVar8 = Constraint::constraintSize(&this->super_Constraint);
    if (sVar5 != sVar8) goto LAB_0016fb5f;
  }
  else {
LAB_0016fb5f:
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"The state constraint matrix at time: ",0x25);
    poVar9 = std::ostream::_M_insert<double>(local_1d0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,
               " has dimensions not matching with the specified state space dimension or constraint dimension."
               ,0x5e);
    psVar10 = Constraint::name_abi_cxx11_(&this->super_Constraint);
    pcVar2 = (psVar10->_M_dataplus)._M_p;
    std::__cxx11::stringbuf::str();
    iDynTree::reportError(pcVar2,"constraintJacobianWRTState",(char *)local_1c8);
    if (local_1c8 != local_1b8) {
      operator_delete(local_1c8,local_1b8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  iDynTree::MatrixDynSize::operator=(jacobian,(MatrixDynSize *)CONCAT44(extraout_var,iVar4));
LAB_0016fcd4:
  if (cVar3 != '\0') {
    return true;
  }
  return false;
}

Assistant:

bool LinearConstraint::constraintJacobianWRTState(double time,
                                                const VectorDynSize& state,
                                                const VectorDynSize& /*control*/,
                                                MatrixDynSize& jacobian)
        {
            jacobian.resize(static_cast<unsigned int>(constraintSize()), state.size());

            if (m_pimpl->constrainsState) {
                bool isValid = false;
                const MatrixDynSize& stateConstraintMatrix = m_pimpl->stateConstraintMatrix->get(time, isValid);

                if (!isValid) {
                    std::ostringstream errorMsg;
                    errorMsg << "Unable to retrieve a valid state constraint matrix at time: " << time << ".";
                    reportError(name().c_str(), "constraintJacobianWRTState", errorMsg.str().c_str());
                    return false;
                }

                if ((stateConstraintMatrix.cols() != state.size()) || (stateConstraintMatrix.rows() != constraintSize())) {
                    std::ostringstream errorMsg;
                    errorMsg << "The state constraint matrix at time: " << time << " has dimensions not matching with the specified state space dimension or constraint dimension.";
                    reportError(name().c_str(), "constraintJacobianWRTState", errorMsg.str().c_str());
                }

                jacobian = stateConstraintMatrix;
            } else {
                jacobian.zero();
            }

            return true;
        }